

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

bool __thiscall
ThreadedReplayer::enqueue_create_shader_module
          (ThreadedReplayer *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  atomic<unsigned_int> *paVar1;
  mutex *__mutex;
  SharedControlBlock *pSVar2;
  VkValidationCacheEXT pVVar3;
  DatabaseInterface *pDVar4;
  spv_target_env env;
  Hash HVar5;
  VkResult VVar6;
  int iVar7;
  size_type sVar8;
  spv_validator_options options;
  long lVar9;
  long lVar10;
  mapped_type *pmVar11;
  pointer pPVar12;
  bool bVar13;
  uint i;
  uint uVar14;
  lock_guard<std::mutex> lock;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  Hash hash_local;
  _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d0;
  pointer local_c8;
  pthread_mutex_t *local_c0;
  SpirvTools context;
  undefined8 local_a8;
  uint8_t auStack_a0 [40];
  VkShaderModuleValidationCacheCreateInfoEXT validation_info;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  *module = (VkShaderModule)0x0;
  uVar14 = *(uint *)(in_FS_OFFSET + -0x18);
  pPVar12 = (this->per_thread_data).
            super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar15 = pPVar12[uVar14].expected_hash == hash;
  bVar16 = pPVar12[uVar14].expected_tag == RESOURCE_SHADER_MODULE;
  bVar13 = bVar16 && bVar15;
  hash_local = hash;
  if (bVar16 && bVar15) {
    pPVar12 = pPVar12 + uVar14;
    pPVar12->acknowledge_parsing_work = true;
    sVar8 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->masked_shader_modules)._M_h,&hash_local);
    if ((sVar8 != 0) ||
       (bVar15 = resource_is_blacklisted(this,RESOURCE_SHADER_MODULE,hash_local), bVar15)) {
      std::mutex::lock(&this->internal_enqueue_mutex);
      Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                (&this->shader_modules,hash_local,*module,1);
      pSVar2 = (this->opts).control_block;
      if (pSVar2 != (SharedControlBlock *)0x0) {
        LOCK();
        paVar1 = &pSVar2->banned_modules;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_c8 = pPVar12;
      if (((this->opts).spirv_validate == true) &&
         (bVar15 = has_resource_in_whitelist(this,RESOURCE_SHADER_MODULE,hash_local), !bVar15)) {
        local_d0 = (_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)std::chrono::_V2::steady_clock::now();
        env = SPV_ENV_VULKAN_1_3;
        if (((this->device)._M_t.
             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->api_version ==
            0) {
          env = SPV_ENV_VULKAN_1_0;
        }
        spvtools::SpirvTools::SpirvTools(&context,env);
        options = spvValidatorOptionsCreate();
        bVar15 = Fossilize::FeatureFilter::supports_scalar_block_layout
                           (&((this->device)._M_t.
                              super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                              .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)
                             ->feature_filter);
        spvValidatorOptionsSetScalarBlockLayout(options,bVar15);
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_40 = std::
                   _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:1992:31)>
                   ::_M_invoke;
        local_48 = std::
                   _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:1992:31)>
                   ::_M_manager;
        spvtools::SpirvTools::SetMessageConsumer(&context,(MessageConsumer *)&local_58);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        bVar15 = spvtools::SpirvTools::Validate
                           (&context,create_info->pCode,create_info->codeSize >> 2,options);
        lVar9 = std::chrono::_V2::steady_clock::now();
        LOCK();
        (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i =
             (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i +
             (lVar9 - (long)local_d0);
        UNLOCK();
        if (!bVar15) {
          fprintf(_stderr,"Fossilize WARN: Failed to validate SPIR-V module: %0lX, skipping!\n",
                  hash_local);
          fflush(_stderr);
          *module = (VkShaderModule)0x0;
          std::mutex::lock(&this->internal_enqueue_mutex);
          Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                    (&this->shader_modules,hash_local,(VkShaderModule_T *)0x0,1);
          LOCK();
          (this->shader_module_count).super___atomic_base<unsigned_int>._M_i =
               (this->shader_module_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          pSVar2 = (this->opts).control_block;
          if (pSVar2 != (SharedControlBlock *)0x0) {
            LOCK();
            paVar1 = &pSVar2->module_validation_failures;
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
            UNLOCK();
          }
          blacklist_resource(this,RESOURCE_SHADER_MODULE,hash_local);
          pthread_mutex_unlock((pthread_mutex_t *)&this->internal_enqueue_mutex);
          spvValidatorOptionsDestroy(options);
          spvtools::SpirvTools::~SpirvTools(&context);
          return bVar13;
        }
        spvValidatorOptionsDestroy(options);
        spvtools::SpirvTools::~SpirvTools(&context);
        pPVar12 = local_c8;
      }
      bVar15 = Fossilize::FeatureFilter::shader_module_is_supported
                         (&((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           feature_filter,create_info);
      if (bVar15) {
        pPVar12->triggered_validation_error = false;
        __mutex = &this->internal_enqueue_mutex;
        local_d0 = (_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->shader_module_to_hash;
        local_c0 = (pthread_mutex_t *)&this->module_identifier_db_mutex;
        for (uVar14 = 0; uVar14 < this->loop_count; uVar14 = uVar14 + 1) {
          if (*module != (VkShaderModule)0x0) {
            (*vkDestroyShaderModule)
                      (((this->device)._M_t.
                        super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                        .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                       device,*module,(VkAllocationCallbacks *)0x0);
          }
          *module = (VkShaderModule)0x0;
          validation_info.validationCache = (VkValidationCacheEXT)0x0;
          validation_info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT;
          validation_info._4_4_ = 0;
          validation_info.pNext = (void *)0x0;
          pVVar3 = this->validation_cache;
          if (pVVar3 != (VkValidationCacheEXT)0x0) {
            create_info->pNext = &validation_info;
            validation_info.validationCache = pVVar3;
          }
          lVar9 = std::chrono::_V2::steady_clock::now();
          VVar6 = (*vkCreateShaderModule)
                            (((this->device)._M_t.
                              super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                              .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)
                             ->device,create_info,(VkAllocationCallbacks *)0x0,module);
          if (VVar6 == VK_SUCCESS) {
            lVar10 = std::chrono::_V2::steady_clock::now();
            LOCK();
            (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i =
                 (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i + (lVar10 - lVar9)
            ;
            UNLOCK();
            LOCK();
            (this->shader_module_count).super___atomic_base<unsigned_int>._M_i =
                 (this->shader_module_count).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
            if (this->robustness == true) {
              std::mutex::lock(__mutex);
              HVar5 = hash_local;
              pmVar11 = std::__detail::
                        _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_d0,module);
              *pmVar11 = HVar5;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            }
            if (uVar14 == 0) {
              if ((this->module_identifier_db)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl !=
                  (DatabaseInterface *)0x0) {
                auStack_a0[8] = '\0';
                auStack_a0[9] = '\0';
                auStack_a0[10] = '\0';
                auStack_a0[0xb] = '\0';
                auStack_a0[0xc] = '\0';
                auStack_a0[0xd] = '\0';
                auStack_a0[0xe] = '\0';
                auStack_a0[0xf] = '\0';
                auStack_a0[0x10] = '\0';
                auStack_a0[0x11] = '\0';
                auStack_a0[0x12] = '\0';
                auStack_a0[0x13] = '\0';
                auStack_a0[0x14] = '\0';
                auStack_a0[0x15] = '\0';
                auStack_a0[0x16] = '\0';
                auStack_a0[0x17] = '\0';
                local_a8 = 0;
                auStack_a0[0] = '\0';
                auStack_a0[1] = '\0';
                auStack_a0[2] = '\0';
                auStack_a0[3] = '\0';
                auStack_a0[4] = '\0';
                auStack_a0[5] = '\0';
                auStack_a0[6] = '\0';
                auStack_a0[7] = '\0';
                auStack_a0[0x18] = '\0';
                auStack_a0[0x19] = '\0';
                auStack_a0[0x1a] = '\0';
                auStack_a0[0x1b] = '\0';
                auStack_a0[0x1c] = 0;
                auStack_a0[0x1d] = 0;
                auStack_a0[0x1e] = 0;
                auStack_a0[0x1f] = 0;
                context.impl_._M_t.
                super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl =
                     (unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                      )(__uniq_ptr_data<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>,_true,_true>
                        )0x3ba1d6b3;
                (*vkGetShaderModuleIdentifierEXT)
                          (((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           device,*module,(VkShaderModuleIdentifierEXT *)&context);
                std::mutex::lock((mutex *)&local_c0->__data);
                pDVar4 = (this->module_identifier_db)._M_t.
                         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
                iVar7 = (*pDVar4->_vptr_DatabaseInterface[5])(pDVar4,4,hash_local);
                if ((char)iVar7 == '\0') {
                  pDVar4 = (this->module_identifier_db)._M_t.
                           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                           _M_head_impl;
                  (*pDVar4->_vptr_DatabaseInterface[4])
                            (pDVar4,4,hash_local,(long)&local_a8 + 4,local_a8 & 0xffffffff,8);
                }
                pthread_mutex_unlock(local_c0);
              }
              pSVar2 = (this->opts).control_block;
              if (pSVar2 != (SharedControlBlock *)0x0) {
                LOCK();
                paVar1 = &pSVar2->successful_modules;
                (paVar1->super___atomic_base<unsigned_int>)._M_i =
                     (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
                UNLOCK();
              }
              Fossilize::FeatureFilter::register_shader_module_info
                        (&((this->device)._M_t.
                           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                          feature_filter,*module,create_info);
            }
          }
          else {
            fprintf(_stderr,"Fossilize ERROR: Failed to create shader module for hash 0x%016lx.\n",
                    hash_local);
            fflush(_stderr);
          }
        }
        std::mutex::lock(__mutex);
        Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                  (&this->shader_modules,hash_local,*module,create_info->codeSize);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (local_c8->triggered_validation_error != false) {
          blacklist_resource(this,RESOURCE_SHADER_MODULE,hash_local);
          return bVar13;
        }
        whitelist_resource(this,RESOURCE_SHADER_MODULE,hash_local);
        return bVar13;
      }
      fprintf(_stderr,"Fossilize WARN: Shader module %0lx is not supported on this device.\n",
              hash_local);
      fflush(_stderr);
      *module = (VkShaderModule)0x0;
      std::mutex::lock(&this->internal_enqueue_mutex);
      Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                (&this->shader_modules,hash_local,(VkShaderModule_T *)0x0,1);
      LOCK();
      (this->shader_module_count).super___atomic_base<unsigned_int>._M_i =
           (this->shader_module_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      pSVar2 = (this->opts).control_block;
      if (pSVar2 != (SharedControlBlock *)0x0) {
        LOCK();
        paVar1 = &pSVar2->module_validation_failures;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->internal_enqueue_mutex);
  }
  else {
    fwrite("Fossilize ERROR: Unexpected resource type or hash in blob, ignoring.\n",0x45,1,_stderr);
    fflush(_stderr);
  }
  return bVar13;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		*module = VK_NULL_HANDLE;

		auto &per_thread = get_per_thread_data();
		if (per_thread.expected_hash != hash || per_thread.expected_tag != RESOURCE_SHADER_MODULE)
		{
			LOGE("Unexpected resource type or hash in blob, ignoring.\n");
			return false;
		}

		per_thread.acknowledge_parsing_work = true;

		if (masked_shader_modules.count(hash) || resource_is_blacklisted(RESOURCE_SHADER_MODULE, hash))
		{
			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, *module, 1);
			if (opts.control_block)
				opts.control_block->banned_modules.fetch_add(1, std::memory_order_relaxed);
			return true;
		}

#ifdef FOSSILIZE_REPLAYER_SPIRV_VAL
		if (opts.spirv_validate && !has_resource_in_whitelist(RESOURCE_SHADER_MODULE, hash))
		{
			auto start_time = chrono::steady_clock::now();
			spv_target_env env;
			if (device->get_api_version() >= VK_VERSION_1_3)
				env = SPV_ENV_VULKAN_1_3;
			else if (device->get_api_version() >= VK_VERSION_1_2)
				env = SPV_ENV_VULKAN_1_2;
			else if (device->get_api_version() >= VK_VERSION_1_1)
				env = SPV_ENV_VULKAN_1_1;
			else
				env = SPV_ENV_VULKAN_1_0;

			spvtools::SpirvTools context(env);
			spvtools::ValidatorOptions validation_opts;
			validation_opts.SetScalarBlockLayout(device->get_feature_filter().supports_scalar_block_layout());
			context.SetMessageConsumer([](spv_message_level_t, const char *, const spv_position_t &, const char *message) {
				LOGE("spirv-val: %s\n", message);
			});

			bool ret = context.Validate(create_info->pCode, create_info->codeSize / 4, validation_opts);

			auto end_time = chrono::steady_clock::now();
			auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();
			shader_module_ns.fetch_add(duration_ns, std::memory_order_relaxed);

			if (!ret)
			{
				LOGW("Failed to validate SPIR-V module: %0" PRIX64 ", skipping!\n", hash);
				*module = VK_NULL_HANDLE;
				lock_guard<mutex> lock(internal_enqueue_mutex);
				//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
				shader_modules.insert_object(hash, VK_NULL_HANDLE, 1);
				shader_module_count.fetch_add(1, std::memory_order_relaxed);

				if (opts.control_block)
					opts.control_block->module_validation_failures.fetch_add(1, std::memory_order_relaxed);

				blacklist_resource(RESOURCE_SHADER_MODULE, hash);
				return true;
			}
		}
#endif

		if (!device->get_feature_filter().shader_module_is_supported(create_info))
		{
			LOGW("Shader module %0" PRIx64 " is not supported on this device.\n", hash);
			*module = VK_NULL_HANDLE;

			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, VK_NULL_HANDLE, 1);
			shader_module_count.fetch_add(1, std::memory_order_relaxed);

			if (opts.control_block)
				opts.control_block->module_validation_failures.fetch_add(1, std::memory_order_relaxed);

			return true;
		}

		per_thread.triggered_validation_error = false;

		for (unsigned i = 0; i < loop_count; i++)
		{
			// Avoid leak.
			if (*module != VK_NULL_HANDLE)
				vkDestroyShaderModule(device->get_device(), *module, nullptr);
			*module = VK_NULL_HANDLE;

			VkShaderModuleValidationCacheCreateInfoEXT validation_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT };
			if (validation_cache)
			{
				validation_info.validationCache = validation_cache;
				const_cast<VkShaderModuleCreateInfo *>(create_info)->pNext = &validation_info;
			}

			auto start_time = chrono::steady_clock::now();
			if (vkCreateShaderModule(device->get_device(), create_info, nullptr, module) == VK_SUCCESS)
			{
				auto end_time = chrono::steady_clock::now();
				auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();
				shader_module_ns.fetch_add(duration_ns, std::memory_order_relaxed);
				shader_module_count.fetch_add(1, std::memory_order_relaxed);

				if (robustness)
				{
					lock_guard<mutex> lock(internal_enqueue_mutex);
					shader_module_to_hash[*module] = hash;
				}

				if (i == 0 && module_identifier_db)
				{
					VkShaderModuleIdentifierEXT ident = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
					vkGetShaderModuleIdentifierEXT(device->get_device(), *module, &ident);
					std::lock_guard<std::mutex> holder{module_identifier_db_mutex};
					if (!module_identifier_db->has_entry(RESOURCE_SHADER_MODULE, hash))
					{
						module_identifier_db->write_entry(RESOURCE_SHADER_MODULE, hash,
						                                  ident.identifier, ident.identifierSize,
						                                  PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);
					}
				}

				if (opts.control_block && i == 0)
					opts.control_block->successful_modules.fetch_add(1, std::memory_order_relaxed);

				if (i == 0)
					device->get_feature_filter().register_shader_module_info(*module, create_info);
			}
			else
			{
				LOGE("Failed to create shader module for hash 0x%016" PRIx64 ".\n", hash);
			}
		}

		{
			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, *module, create_info->codeSize);
		}

		// vkCreateShaderModule doesn't generally crash anything, so just deal with blacklisting here
		// rather than in an error callback.
		if (!per_thread.triggered_validation_error)
			whitelist_resource(RESOURCE_SHADER_MODULE, hash);
		else
			blacklist_resource(RESOURCE_SHADER_MODULE, hash);

		return true;
	}